

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O2

int lws_x509_parse_from_pem(lws_x509_cert *x509,void *pem,size_t len)

{
  BIO_METHOD *type;
  BIO *b;
  X509 *pXVar1;
  int iVar2;
  
  type = BIO_s_mem();
  b = BIO_new(type);
  BIO_write(b,pem,(int)len);
  iVar2 = 0;
  pXVar1 = PEM_read_bio_X509(b,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
  x509->cert = (X509 *)pXVar1;
  BIO_free(b);
  if (x509->cert == (X509 *)0x0) {
    _lws_log(1,"%s: unable to parse PEM cert\n","lws_x509_parse_from_pem");
    lws_tls_err_describe_clear();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
lws_x509_parse_from_pem(struct lws_x509_cert *x509, const void *pem, size_t len)
{
	BIO* bio = BIO_new(BIO_s_mem());

	BIO_write(bio, pem, (int)len);
	x509->cert = PEM_read_bio_X509(bio, NULL, NULL, NULL);
	BIO_free(bio);
	if (!x509->cert) {
		lwsl_err("%s: unable to parse PEM cert\n", __func__);
		lws_tls_err_describe_clear();

		return -1;
	}

	return 0;
}